

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_AnnotateIndentNewline_Test::TestBody
          (PrinterTest_AnnotateIndentNewline_Test *this)

{
  ZeroCopyOutputStream *output;
  Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record> *matchers;
  ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>
  *matcher;
  char *pcVar1;
  _Head_base<0UL,_int,_false> path;
  FakeDescriptor *descriptor_00;
  string_view text;
  initializer_list<int> __l;
  string_view begin_varname;
  string_view text_00;
  string_view end_varname;
  ulong uVar2;
  allocator_type local_1e1;
  AssertionResult gtest_ar_1;
  FakeDescriptor descriptor;
  FakeAnnotationCollector_conflict collector;
  Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record> local_170
  ;
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
  local_160;
  Printer printer;
  
  collector.super_AnnotationCollector._vptr_AnnotationCollector =
       (_func_int **)&PTR__FakeAnnotationCollector_016659c8;
  collector.annotations_.
  super__Vector_base<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::allocator<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  collector.annotations_.
  super__Vector_base<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::allocator<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  collector.annotations_.
  super__Vector_base<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::allocator<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output = PrinterTest::output(&this->super_PrinterTest);
  Printer::Printer(&printer,output,'$',&collector.super_AnnotationCollector);
  printer.indent_ = printer.indent_ + printer.options_.spaces_per_indent;
  pcVar1 = anon_var_dwarf_651463 + 5;
  text._M_str = "$A$$N$$B$C\n";
  text._M_len = 0xb;
  Printer::Print<char[2],char[1],char[2],char[3],char[2],char[1]>
            (&printer,text,(char (*) [2])0xe70b12,(char (*) [1])(anon_var_dwarf_651463 + 5),
             (char (*) [2])0x113e185,(char (*) [3])"\nz",(char (*) [2])0x113fd36,
             (char (*) [1])(anon_var_dwarf_651463 + 5));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&descriptor,"path",(allocator<char> *)&local_170);
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_3_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&gtest_ar_1;
  std::vector<int,_std::allocator<int>_>::vector(&descriptor.path,__l,&local_1e1);
  uVar2 = 0;
  descriptor_00 = &descriptor;
  begin_varname._M_str = "A";
  begin_varname._M_len = 1;
  end_varname._M_str = "B";
  end_varname._M_len = 1;
  Printer::Annotate<google::protobuf::io::(anonymous_namespace)::FakeDescriptor>
            (&printer,begin_varname,end_varname,descriptor_00,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  path._M_head_impl = (int)descriptor_00;
  Printer::Outdent(&printer);
  text_00._M_str = "\n";
  text_00._M_len = 1;
  Printer::Print<>(&printer,text_00);
  FakeDescriptor::~FakeDescriptor(&descriptor);
  Printer::~Printer(&printer);
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  descriptor.fake_file.filename._M_string_length =
       (size_type)(this->super_PrinterTest).out_._M_dataplus._M_p;
  descriptor.fake_file.filename._M_dataplus._M_p =
       (pointer)(this->super_PrinterTest).out_._M_string_length;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ((internal *)&printer,"written()","\"\\nz  C\\n\\n\"",
             (basic_string_view<char,_std::char_traits<char>_> *)&descriptor,
             (char (*) [8])"\nz  C\n\n");
  if ((char)printer.sink_.stream_ == '\0') {
    testing::Message::Message((Message *)&descriptor);
    if (printer.sink_.buffer_ != (void *)0x0) {
      pcVar1 = *printer.sink_.buffer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x160,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&descriptor);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (descriptor.fake_file.filename._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)descriptor.fake_file.filename._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&printer.sink_.buffer_);
  io::(anonymous_namespace)::
  Annotation<int,int,char_const*,testing::internal::ElementsAreMatcher<std::tuple<int>>,std::optional<google::protobuf::io::AnnotationCollector::Semantic>>
            ((Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
              *)&descriptor,(_anonymous_namespace_ *)0x0,4,0xeb80e5,(char *)0x0,
             (ElementsAreMatcher<std::tuple<int>_>)path._M_head_impl,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)
             (uVar2 & 0xffffffff00000000));
  testing::
  ElementsAre<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>
            ((ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>
              *)&local_160,(testing *)&descriptor,matchers);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>>>
            ((PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>_>
              *)&printer,(internal *)&local_160,matcher);
  local_170.len_ =
       ((long)collector.annotations_.
              super__Vector_base<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::allocator<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)collector.annotations_.
             super__Vector_base<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::allocator<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x50;
  local_170.ptr_ =
       collector.annotations_.
       super__Vector_base<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::allocator<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>
       ._M_impl.super__Vector_impl_data._M_start;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>>>
  ::operator()(&gtest_ar_1,(char *)&printer,&local_170);
  testing::internal::
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>::
  ~MatcherBase((MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
                *)&printer);
  testing::internal::
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>::
  ~MatcherBase(&local_160);
  testing::internal::
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>::
  ~MatcherBase((MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
                *)&descriptor);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&printer);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&descriptor,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x163,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&descriptor,(Message *)&printer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&descriptor);
    if ((long *)CONCAT71(printer.sink_.stream_._1_7_,(char)printer.sink_.stream_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(printer.sink_.stream_._1_7_,(char)printer.sink_.stream_) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  FakeAnnotationCollector::~FakeAnnotationCollector((FakeAnnotationCollector *)&collector);
  return;
}

Assistant:

TEST_F(PrinterTest, AnnotateIndentNewline) {
  FakeAnnotationCollector collector;
  {
    Printer printer(output(), '$', &collector);
    printer.Indent();

    printer.Print("$A$$N$$B$C\n", "A", "", "N", "\nz", "B", "");
    FakeDescriptor descriptor{{"path"}, {0}};
    printer.Annotate("A", "B", &descriptor);

    printer.Outdent();
    printer.Print("\n");
  }
  EXPECT_EQ(written(), "\nz  C\n\n");

  EXPECT_THAT(collector.Get(),
              ElementsAre(Annotation(0, 4, "path", ElementsAre(0))));
}